

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void terminate(void)

{
  _GLFWmonitor *monitor;
  _GLFWerror *__ptr;
  long lVar1;
  
  _glfw.callbacks.monitor = (GLFWmonitorfun)0x0;
  _glfw.callbacks.joystick = (GLFWjoystickfun)0x0;
  while (_glfw.windowListHead != (_GLFWwindow *)0x0) {
    glfwDestroyWindow((GLFWwindow *)_glfw.windowListHead);
  }
  while (_glfw.cursorListHead != (_GLFWcursor *)0x0) {
    glfwDestroyCursor((GLFWcursor *)_glfw.cursorListHead);
  }
  if (0 < _glfw.monitorCount) {
    lVar1 = 0;
    do {
      monitor = _glfw.monitors[lVar1];
      if ((monitor->originalRamp).size != 0) {
        _glfwPlatformSetGammaRamp(monitor,&monitor->originalRamp);
      }
      _glfwFreeMonitor(monitor);
      lVar1 = lVar1 + 1;
    } while (lVar1 < _glfw.monitorCount);
  }
  free(_glfw.monitors);
  _glfw.monitors = (_GLFWmonitor **)0x0;
  _glfw.monitorCount = 0;
  free(_glfw.mappings);
  _glfw.mappings = (_GLFWmapping *)0x0;
  _glfw.mappingCount = 0;
  _glfwTerminateVulkan();
  _glfwPlatformTerminate();
  _glfw.initialized = 0;
  while (__ptr = _glfw.errorListHead, _glfw.errorListHead != (_GLFWerror *)0x0) {
    _glfw.errorListHead = (_glfw.errorListHead)->next;
    free(__ptr);
  }
  _glfwPlatformDestroyTls(&_glfw.contextSlot);
  _glfwPlatformDestroyTls(&_glfw.errorSlot);
  _glfwPlatformDestroyMutex(&_glfw.errorLock);
  memset(&_glfw,0,0x20978);
  return;
}

Assistant:

static void terminate(void)
{
    int i;

    memset(&_glfw.callbacks, 0, sizeof(_glfw.callbacks));

    while (_glfw.windowListHead)
        glfwDestroyWindow((GLFWwindow*) _glfw.windowListHead);

    while (_glfw.cursorListHead)
        glfwDestroyCursor((GLFWcursor*) _glfw.cursorListHead);

    for (i = 0;  i < _glfw.monitorCount;  i++)
    {
        _GLFWmonitor* monitor = _glfw.monitors[i];
        if (monitor->originalRamp.size)
            _glfwPlatformSetGammaRamp(monitor, &monitor->originalRamp);
        _glfwFreeMonitor(monitor);
    }

    free(_glfw.monitors);
    _glfw.monitors = NULL;
    _glfw.monitorCount = 0;

    free(_glfw.mappings);
    _glfw.mappings = NULL;
    _glfw.mappingCount = 0;

    _glfwTerminateVulkan();
    _glfwPlatformTerminate();

    _glfw.initialized = GLFW_FALSE;

    while (_glfw.errorListHead)
    {
        _GLFWerror* error = _glfw.errorListHead;
        _glfw.errorListHead = error->next;
        free(error);
    }

    _glfwPlatformDestroyTls(&_glfw.contextSlot);
    _glfwPlatformDestroyTls(&_glfw.errorSlot);
    _glfwPlatformDestroyMutex(&_glfw.errorLock);

    memset(&_glfw, 0, sizeof(_glfw));
}